

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O2

void __thiscall NaConfigPart::NaConfigPart(NaConfigPart *this,NaConfigPart *rCP)

{
  char *__s;
  char *szInstance;
  size_t sVar1;
  char *__dest;
  
  this->_vptr_NaConfigPart = (_func_int **)&PTR__NaConfigPart_00173e90;
  __s = rCP->szTypeName;
  szInstance = rCP->szInstanceName;
  sVar1 = strlen(__s);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->szTypeName = __dest;
  strcpy(__dest,__s);
  this->szInstanceName = (char *)0x0;
  SetInstance(this,szInstance);
  this->pSelfData = (void *)0x0;
  return;
}

Assistant:

NaConfigPart::NaConfigPart (const NaConfigPart& rCP)
{
    const char  *szType = rCP.GetType();
    const char  *szInstance = rCP.GetInstance();

    szTypeName = new char[strlen(szType) + 1];
    strcpy(szTypeName, szType);

    szInstanceName = NULL;
    SetInstance(szInstance);

    pSelfData = NULL;
}